

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O2

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::handle
          (SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs> *this,LeafData *ld,
          bool doInsert)

{
  TypedTermList TVar1;
  TypedTermList TVar2;
  anon_class_16_2_6aee48c9 bindSpecialVar;
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  bindings;
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_100;
  SelectedSummand local_f0;
  SelectedSummand local_c0;
  SelectedSummand local_90;
  SelectedSummand local_60;
  
  TVar1 = Kernel::SelectedSummand::key(&ld->super_SelectedSummand);
  TVar2._sort = TVar1._sort._content;
  TVar2.super_TermList._content = TVar2._sort._content;
  TVar2 = Kernel::Renaming::normalize((Renaming *)TVar1.super_TermList._content._content,TVar2);
  Lib::
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(&local_100);
  bindSpecialVar.bindings = &local_100;
  bindSpecialVar.this = this;
  createBindings<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::handle(Inferences::ALASCA::FourierMotzkinConf::Lhs,bool)::_lambda(int,auto:1)_1_>
            (this,TVar2,false,bindSpecialVar);
  if (doInsert) {
    Kernel::SelectedSummand::SelectedSummand(&local_90,&ld->super_SelectedSummand);
    Kernel::SelectedSummand::SelectedSummand(&local_60,&local_90);
    insert(this,(BindingMap *)
                local_100._self._M_t.
                super___uniq_ptr_impl<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_*,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_>_>
                .
                super__Head_base<0UL,_Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_*,_false>
                ._M_head_impl,(LeafData *)&local_60);
  }
  else {
    Kernel::SelectedSummand::SelectedSummand(&local_f0,&ld->super_SelectedSummand);
    Kernel::SelectedSummand::SelectedSummand(&local_c0,&local_f0);
    remove(this,(char *)local_100._self._M_t.
                        super___uniq_ptr_impl<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_*,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_>_>
                        .
                        super__Head_base<0UL,_Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_*,_false>
                        ._M_head_impl);
  }
  Lib::
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_100);
  return;
}

Assistant:

void handle(LeafData ld, bool doInsert)
    {
      auto norm = Renaming::normalize(ld.key());
      Recycled<BindingMap> bindings;
      createBindings(norm, /* reversed */ false,
          [&](int var, auto term) { 
            _nextVar = std::max(_nextVar, var + 1);
            bindings->insert(var, term);
          });
      if (doInsert) insert(*bindings, ld);
      else          remove(*bindings, ld);
    }